

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O0

void __thiscall tcu::x11::egl::WindowFactory::WindowFactory(WindowFactory *this)

{
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  WindowFactory *local_10;
  WindowFactory *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"window",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"X11 Window",&local_69);
  eglu::NativeWindowFactory::NativeWindowFactory
            (&this->super_NativeWindowFactory,&local_30,&local_68,
             CAPABILITY_GET_SCREEN_SIZE|CAPABILITY_SET_SURFACE_SIZE|CAPABILITY_GET_SURFACE_SIZE|
             CAPABILITY_CREATE_SURFACE_PLATFORM|CAPABILITY_CREATE_SURFACE_LEGACY);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_NativeWindowFactory).super_FactoryBase.super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__WindowFactory_0066f690;
  return;
}

Assistant:

WindowFactory::WindowFactory (void)
	: NativeWindowFactory ("window", "X11 Window", Window::CAPABILITIES)
{
}